

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *vec)

{
  uint *puVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  int *piVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_98;
  int *local_58;
  pointer local_50;
  int *local_48;
  int *local_40;
  long local_38;
  
  local_38 = (long)this->thedim;
  if (local_38 != 0) {
    local_50 = (this->l).rval.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (this->l).ridx;
    local_48 = (this->l).rbeg;
    local_40 = (this->l).rorig;
    do {
      lVar5 = (long)local_40[local_38 + -1];
      uVar3 = *(undefined8 *)(vec[lVar5].m_backend.data._M_elems + 8);
      local_d8.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_d8.data._M_elems._0_8_ = *(undefined8 *)vec[lVar5].m_backend.data._M_elems;
      local_d8.data._M_elems._8_8_ = *(undefined8 *)(vec[lVar5].m_backend.data._M_elems + 2);
      puVar1 = vec[lVar5].m_backend.data._M_elems + 4;
      local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_d8.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_d8.exp = vec[lVar5].m_backend.exp;
      local_d8.neg = vec[lVar5].m_backend.neg;
      local_d8.fpclass = vec[lVar5].m_backend.fpclass;
      local_d8.prec_elem = vec[lVar5].m_backend.prec_elem;
      if (local_d8.fpclass == cpp_dec_float_NaN) {
LAB_002b6914:
        iVar4 = local_48[lVar5];
        if (iVar4 < local_48[lVar5 + 1]) {
          piVar7 = local_58 + iVar4;
          pcVar6 = &local_50[iVar4].m_backend;
          iVar4 = (local_48[lVar5 + 1] - iVar4) + 1;
          do {
            local_98.fpclass = cpp_dec_float_finite;
            local_98.prec_elem = 10;
            local_98.data._M_elems[0] = 0;
            local_98.data._M_elems[1] = 0;
            local_98.data._M_elems[2] = 0;
            local_98.data._M_elems[3] = 0;
            local_98.data._M_elems[4] = 0;
            local_98.data._M_elems[5] = 0;
            local_98.data._M_elems._24_5_ = 0;
            local_98.data._M_elems[7]._1_3_ = 0;
            local_98.data._M_elems._32_5_ = 0;
            local_98.data._M_elems[9]._1_3_ = 0;
            local_98.exp = 0;
            local_98.neg = false;
            v = &local_d8;
            if (pcVar6 != &local_98) {
              local_98.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
              local_98.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
              local_98.data._M_elems[4] = local_d8.data._M_elems[4];
              local_98.data._M_elems[5] = local_d8.data._M_elems[5];
              local_98.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
              local_98.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
              local_98.data._M_elems[0] = local_d8.data._M_elems[0];
              local_98.data._M_elems[1] = local_d8.data._M_elems[1];
              local_98.data._M_elems[2] = local_d8.data._M_elems[2];
              local_98.data._M_elems[3] = local_d8.data._M_elems[3];
              local_98.exp = local_d8.exp;
              local_98.neg = local_d8.neg;
              local_98.fpclass = local_d8.fpclass;
              local_98.prec_elem = local_d8.prec_elem;
              v = pcVar6;
            }
            pcVar6 = pcVar6 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_98,v);
            iVar2 = *piVar7;
            piVar7 = piVar7 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&vec[iVar2].m_backend,&local_98);
            iVar4 = iVar4 + -1;
          } while (1 < iVar4);
        }
      }
      else {
        local_98.fpclass = cpp_dec_float_finite;
        local_98.prec_elem = 10;
        local_98.data._M_elems[0] = 0;
        local_98.data._M_elems[1] = 0;
        local_98.data._M_elems[2] = 0;
        local_98.data._M_elems[3] = 0;
        local_98.data._M_elems[4] = 0;
        local_98.data._M_elems[5] = 0;
        local_98.data._M_elems._24_5_ = 0;
        local_98.data._M_elems[7]._1_3_ = 0;
        local_98.data._M_elems._32_5_ = 0;
        local_98.data._M_elems[9]._1_3_ = 0;
        local_98.exp = 0;
        local_98.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_98,0.0);
        iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_d8,&local_98);
        if (iVar4 != 0) goto LAB_002b6914;
      }
      local_38 = local_38 + -1;
    } while (local_38 != 0);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftNoNZ(R* vec)
{
   int i, j, k;
   int r;
   R x;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig;

   ridx = l.ridx;
   rval = l.rval.data();
   rbeg = l.rbeg;
   rorig = l.rorig;

#ifndef SOPLEX_WITH_L_ROWS
   R* lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   i = l.firstUpdate - 1;
   assert(i < thedim);

   for(; i >= 0; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         x += vec[*idx++] * (*val++);
      }

      vec[lrow[i]] -= x;
   }

#else

   for(i = thedim; i--;)
   {
      r = rorig[i];
      x = vec[r];

      if(x != 0.0)
      {
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            vec[*idx++] -= x * *val++;
         }
      }
   }

#endif
}